

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O1

void array_resize(_array *x,int n)

{
  t_template *template;
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  t_word *wp;
  t_word *wp_00;
  
  template = template_findbyname(x->a_templatesym);
  iVar4 = 1;
  if (1 < n) {
    iVar4 = n;
  }
  iVar3 = x->a_n;
  iVar2 = template->t_n * 8;
  pcVar1 = (char *)resizebytes(x->a_vec,(long)(iVar2 * iVar3),(long)(iVar2 * iVar4));
  if (pcVar1 != (char *)0x0) {
    x->a_vec = pcVar1;
    x->a_n = iVar4;
    if ((iVar3 < iVar4) && (iVar4 != iVar3)) {
      wp_00 = (t_word *)(pcVar1 + iVar2 * iVar3);
      iVar3 = iVar3 - iVar4;
      do {
        word_init(wp_00,template,&x->a_gp);
        wp_00 = (t_word *)((long)wp_00 + (long)iVar2);
        iVar3 = iVar3 + 1;
      } while (iVar3 != 0);
    }
    glist_valid = glist_valid + 1;
    x->a_valid = glist_valid;
  }
  return;
}

Assistant:

void array_resize(t_array *x, int n)
{
    int elemsize, oldn;
    char *tmp;
    t_template *template = template_findbyname(x->a_templatesym);
    if (n < 1)
        n = 1;
    oldn = x->a_n;
    elemsize = sizeof(t_word) * template->t_n;

    tmp = (char *)resizebytes(x->a_vec, oldn * elemsize, n * elemsize);
    if (!tmp)
        return;
    x->a_vec = tmp;
    x->a_n = n;
    if (n > oldn)
    {
        char *cp = x->a_vec + elemsize * oldn;
        int i = n - oldn;
        for (; i--; cp += elemsize)
        {
            t_word *wp = (t_word *)cp;
            word_init(wp, template, &x->a_gp);
        }
    }
    x->a_valid = ++glist_valid;
}